

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall IR::IRBuilder::ret(IRBuilder *this,bool result)

{
  BasicBlock *this_00;
  bool bVar1;
  reference local_20;
  bool local_11;
  IRBuilder *pIStack_10;
  bool result_local;
  IRBuilder *this_local;
  
  local_11 = result;
  pIStack_10 = this;
  bVar1 = BasicBlock::isTerminated(this->block_);
  if (!bVar1) {
    std::forward_list<IR::Ret,std::allocator<IR::Ret>>::emplace_front<bool&>
              ((forward_list<IR::Ret,std::allocator<IR::Ret>> *)&this->function_->rets_,&local_11);
    this_00 = this->block_;
    local_20 = std::forward_list<IR::Ret,_std::allocator<IR::Ret>_>::front(&this->function_->rets_);
    std::vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>::push_back
              (&this_00->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>,
               (value_type *)&local_20);
  }
  return;
}

Assistant:

void IRBuilder::ret(bool result) {
  if (block_->isTerminated()) return;
  function_->rets_.emplace_front(result);
  block_->push_back(&function_->rets_.front());
}